

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectangularVolumeRecord3.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::RectangularVolumeRecord3::Decode
          (RectangularVolumeRecord3 *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  RectangularVolumeRecord3 *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x38) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar2 = KDataStream::operator>>(local_18,&(this->super_EnvironmentRecord).m_ui32EnvRecTyp);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->super_EnvironmentRecord).m_ui16Length);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->super_EnvironmentRecord).m_ui8Index);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->super_EnvironmentRecord).m_ui8Padding);
  pKVar2 = operator>>(pKVar2,&(this->m_CentLocation).super_DataTypeBase);
  pKVar2 = operator>>(pKVar2,&(this->m_RecLength).super_DataTypeBase);
  operator>>(pKVar2,&(this->m_Ori).super_DataTypeBase);
  return;
}

Assistant:

void RectangularVolumeRecord3::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < RECTANGLE_VOLUME_RECORD_3_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui32EnvRecTyp
           >> m_ui16Length
           >> m_ui8Index
           >> m_ui8Padding
           >> KDIS_STREAM m_CentLocation
           >> KDIS_STREAM m_RecLength
           >> KDIS_STREAM m_Ori;
}